

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

StructBuilder * __thiscall
capnp::_::ListBuilder::getStructElement
          (StructBuilder *__return_storage_ptr__,ListBuilder *this,ElementCount index)

{
  StructPointerCount SVar1;
  uint uVar2;
  uint uVar3;
  byte *pbVar4;
  CapTableBuilder *pCVar5;
  
  uVar2 = this->step;
  pbVar4 = this->ptr;
  uVar3 = this->structDataSize;
  SVar1 = this->structPointerCount;
  pCVar5 = this->capTable;
  __return_storage_ptr__->segment = this->segment;
  __return_storage_ptr__->capTable = pCVar5;
  __return_storage_ptr__->data = pbVar4 + ((ulong)uVar2 * (ulong)index >> 3);
  __return_storage_ptr__->pointers =
       (WirePointer *)(pbVar4 + ((ulong)uVar2 * (ulong)index >> 3) + (uVar3 >> 3));
  __return_storage_ptr__->dataSize = uVar3;
  __return_storage_ptr__->pointerCount = SVar1;
  return __return_storage_ptr__;
}

Assistant:

StructBuilder ListBuilder::getStructElement(ElementCount index) {
  auto indexBit = upgradeBound<uint64_t>(index) * step;
  byte* structData = ptr + indexBit / BITS_PER_BYTE;
  KJ_DASSERT(indexBit % BITS_PER_BYTE == ZERO * BITS);
  return StructBuilder(segment, capTable, structData,
      reinterpret_cast<WirePointer*>(structData + structDataSize / BITS_PER_BYTE),
      structDataSize, structPointerCount);
}